

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inferdeclnode.cpp
# Opt level: O2

void __thiscall
InferDeclNode::check
          (InferDeclNode *this,
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          *tables)

{
  pointer pmVar1;
  VarNode *pVVar2;
  bool bVar3;
  SemanticException *this_00;
  allocator local_181;
  string varScope;
  string local_160;
  string local_140;
  string local_120;
  SymbolInfo local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_a0;
  
  bVar3 = wasDeclared(tables,&((this->lhs)._M_t.
                               super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>._M_t.
                               super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
                               super__Head_base<0UL,_VarNode_*,_false>._M_head_impl)->name);
  if (!bVar3) {
    varScope._M_dataplus._M_p = (pointer)&varScope.field_2;
    varScope._M_string_length = 0;
    varScope.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&varScope);
    pmVar1 = (tables->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (this->lhs)._M_t.super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>._M_t.
             super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
             super__Head_base<0UL,_VarNode_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_120,"var",&local_181);
    (*((this->rhs)._M_t.super___uniq_ptr_impl<ASTNode,_std::default_delete<ASTNode>_>._M_t.
       super__Tuple_impl<0UL,_ASTNode_*,_std::default_delete<ASTNode>_>.
       super__Head_base<0UL,_ASTNode_*,_false>._M_head_impl)->_vptr_ASTNode[6])(&local_140);
    std::__cxx11::string::string((string *)&local_160,(string *)&varScope);
    SymbolInfo::SymbolInfo(&local_100,&local_120,&local_140,&local_160);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_SymbolInfo,_true>
              (&local_a0,&pVVar2->name,&local_100);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,SymbolInfo>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SymbolInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,SymbolInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)(pmVar1 + -1),&local_a0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::~pair(&local_a0);
    SymbolInfo::~SymbolInfo(&local_100);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&varScope);
    return;
  }
  this_00 = (SemanticException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_100.kind,"error: multiple definition of \'",
                 &((this->lhs)._M_t.super___uniq_ptr_impl<VarNode,_std::default_delete<VarNode>_>.
                   _M_t.super__Tuple_impl<0UL,_VarNode_*,_std::default_delete<VarNode>_>.
                   super__Head_base<0UL,_VarNode_*,_false>._M_head_impl)->name);
  std::operator+(&local_a0.first,&local_100.kind,"\'");
  SemanticException::SemanticException(this_00,&local_a0.first);
  __cxa_throw(this_00,&SemanticException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void InferDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, lhs->name)) {
        throw SemanticException("error: multiple definition of '" + lhs->name + "'");
    } else {
        auto varScope = std::string();
        if (tables.size() == 1) {
            varScope = "global";
        } else {
            varScope = "local";
        }

        tables.back().emplace(std::make_pair(lhs->name, SymbolInfo("var", rhs->getType(), varScope)));
//        std::cout << "new var added to table: named " << lhs->name << ", type: "
//                  << rhs->getType() << ", scope: " << varScope << "\n";
    }
}